

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_align_search.c
# Opt level: O3

char * state_align_search_hyp(ps_search_t *search,int32 *out_score)

{
  dictword_t *pdVar1;
  int iVar2;
  ps_alignment_iter_t *ppVar3;
  ps_alignment_entry_t *ppVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  
  if (search->hyp_str != (char *)0x0) {
    ckd_free(search->hyp_str);
  }
  search->hyp_str = (char *)0x0;
  if (((ps_alignment_t *)search[1].type == (ps_alignment_t *)0x0) ||
     (ppVar3 = ps_alignment_words((ps_alignment_t *)search[1].type),
     ppVar3 == (ps_alignment_iter_t *)0x0)) {
    pcVar6 = (char *)0x0;
  }
  else {
    lVar7 = 0;
    do {
      ppVar4 = ps_alignment_iter_get(ppVar3);
      iVar2 = dict_real_word(search->dict,(ppVar4->id).wid);
      if (iVar2 != 0) {
        pdVar1 = search->dict->word;
        ppVar4 = ps_alignment_iter_get(ppVar3);
        pcVar6 = pdVar1[pdVar1[(ppVar4->id).wid].basewid].word;
        if (pcVar6 == (char *)0x0) {
          ppVar4 = ps_alignment_iter_get(ppVar3);
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                  ,0x188,"Unknown word id %d in alignment",(ulong)(uint)(ppVar4->id).wid);
          return (char *)0x0;
        }
        sVar5 = strlen(pcVar6);
        lVar7 = lVar7 + sVar5 + 1;
      }
      ppVar3 = ps_alignment_iter_next(ppVar3);
    } while (ppVar3 != (ps_alignment_iter_t *)0x0);
    pcVar6 = (char *)__ckd_calloc__(lVar7 + 1,1,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                                    ,0x18e);
    search->hyp_str = pcVar6;
    for (ppVar3 = ps_alignment_words((ps_alignment_t *)search[1].type);
        ppVar3 != (ps_alignment_iter_t *)0x0; ppVar3 = ps_alignment_iter_next(ppVar3)) {
      ppVar4 = ps_alignment_iter_get(ppVar3);
      iVar2 = dict_real_word(search->dict,(ppVar4->id).wid);
      if (iVar2 != 0) {
        pdVar1 = search->dict->word;
        strcat(search->hyp_str,pdVar1[pdVar1[(ppVar4->id).wid].basewid].word);
        pcVar6 = search->hyp_str;
        sVar5 = strlen(pcVar6);
        pcVar6 = pcVar6 + sVar5;
        pcVar6[0] = ' ';
        pcVar6[1] = '\0';
      }
      *out_score = ppVar4->score;
    }
    pcVar6 = search->hyp_str;
    sVar5 = strlen(pcVar6);
    pcVar6[sVar5 - 1] = '\0';
    pcVar6 = search->hyp_str;
  }
  return pcVar6;
}

Assistant:

static char const *
state_align_search_hyp(ps_search_t *search, int32 *out_score)
{
    state_align_search_t *sas = (state_align_search_t *)search;
    ps_alignment_iter_t *itor;
    size_t hyp_len;

    if (search->hyp_str)
        ckd_free(search->hyp_str);
    search->hyp_str = NULL;
    if (sas->al == NULL)
        return NULL;
    itor = ps_alignment_words(sas->al);
    if (itor == NULL)
        return NULL;
    for (hyp_len = 0; itor; itor = ps_alignment_iter_next(itor)) {
        const char *word;
        int32 wid = ps_alignment_iter_get(itor)->id.wid;

        if (dict_real_word(ps_search_dict(search), wid)) {
            word = dict_basestr(ps_search_dict(search),
                                ps_alignment_iter_get(itor)->id.wid);
            if (word == NULL) {
                E_ERROR("Unknown word id %d in alignment",
                        ps_alignment_iter_get(itor)->id.wid);
                return NULL;
            }
            hyp_len += strlen(word) + 1;
        }
    }
    search->hyp_str = ckd_calloc(hyp_len + 1, sizeof(*search->hyp_str));
    for (itor = ps_alignment_words(sas->al);
         itor; itor = ps_alignment_iter_next(itor)) {
        ps_alignment_entry_t *ent = ps_alignment_iter_get(itor);
        int32 wid = ent->id.wid;
        const char *word;
        if (dict_real_word(ps_search_dict(search), wid)) {
            word = dict_basestr(ps_search_dict(search),
                                ent->id.wid);
            strcat(search->hyp_str, word);
            strcat(search->hyp_str, " ");
        }
        *out_score = ent->score;
    }
    search->hyp_str[strlen(search->hyp_str) - 1] = '\0';
    return search->hyp_str;
}